

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

void CVmBifTADS::make_string(uint argc)

{
  ushort *puVar1;
  uint uVar2;
  int iVar3;
  vm_val_t *pvVar4;
  size_t sVar5;
  long lVar6;
  vm_obj_id_t vVar7;
  ulong uVar8;
  ulong uVar9;
  char *p;
  vm_val_t val;
  vm_val_t ele_val;
  vm_val_t local_88;
  vm_obj_id_t local_70;
  uint local_6c;
  ushort *local_68;
  ulong local_60;
  vm_val_t local_58;
  vm_val_t local_48;
  ushort *local_38;
  
  CVmBif::check_argc_range(argc,1,2);
  local_88.typ = sp_[-1].typ;
  local_88._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
  local_88.val = sp_[-1].val;
  uVar9 = 1;
  pvVar4 = sp_ + -1;
  if (1 < argc) {
    sp_ = sp_ + -1;
    uVar2 = CVmBif::pop_long_val();
    if ((int)uVar2 < 0) goto LAB_00226895;
    uVar9 = (ulong)uVar2;
    pvVar4 = sp_;
  }
  sp_ = pvVar4 + 1;
  pvVar4->typ = local_88.typ;
  *(undefined4 *)&pvVar4->field_0x4 = local_88._4_4_;
  pvVar4->val = local_88.val;
  local_60 = uVar9;
  switch(local_88.typ) {
  case VM_OBJ:
    local_68 = (ushort *)vm_val_t::get_as_string(&local_88);
    if (local_68 != (ushort *)0x0) goto LAB_002266c1;
    iVar3 = vm_val_t::is_listlike(&local_88);
    if ((iVar3 == 0) || (uVar2 = vm_val_t::ll_length(&local_88), (int)uVar2 < 0))
    goto switchD_00226668_caseD_6;
    break;
  default:
switchD_00226668_caseD_6:
    err_throw(0x900);
  case VM_INT:
    uVar8 = 1;
    if (0x7f < local_88.val.intval) {
      uVar8 = 3 - (ulong)(local_88.val.obj < 0x800);
    }
    uVar2 = 0xffffffff;
    goto LAB_00226774;
  case VM_SSTRING:
    local_68 = (ushort *)
               (G_const_pool_X.super_CVmPoolPaged.pages_
                [local_88.val.obj >>
                 ((byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem +
               (G_const_pool_X.super_CVmPoolPaged._8_4_ - 1 & local_88.val.obj));
LAB_002266c1:
    uVar8 = (ulong)*local_68;
    uVar2 = 0xffffffff;
    goto LAB_00226776;
  case VM_LIST:
    uVar2 = vm_val_t::ll_length(&local_88);
  }
  if ((int)uVar2 < 1) {
    uVar8 = 0;
  }
  else {
    vVar7 = 1;
    uVar8 = 0;
    do {
      local_58.typ = VM_INT;
      local_58.val.obj = vVar7;
      vm_val_t::ll_index(&local_88,&local_48,&local_58);
      if (local_48.typ != VM_INT) {
        err_throw(0x7d5);
      }
      lVar6 = 3 - (ulong)(local_48.val.obj < 0x800);
      if (local_48.val.intval < L'\x80') {
        lVar6 = 1;
      }
      uVar8 = uVar8 + lVar6;
      vVar7 = vVar7 + 1;
      uVar9 = local_60;
    } while ((int)vVar7 <= (int)uVar2);
  }
LAB_00226774:
  local_68 = (ushort *)0x0;
LAB_00226776:
  if (uVar8 * uVar9 < 0xfffe) {
    local_70 = CVmObjString::create(0,uVar8 * uVar9);
    if (uVar9 != 0) {
      p = (char *)(*(long *)((long)&G_obj_table_X.pages_[local_70 >> 0xc][local_70 & 0xfff].ptr_ + 8
                            ) + 2);
      local_38 = local_68 + 1;
      local_6c = uVar2;
      do {
        puVar1 = local_68;
        if ((int)local_6c < 0) {
          if (local_68 == (ushort *)0x0) {
            uVar9 = utf8_ptr::s_putch(p,local_88.val.intval);
          }
          else {
            memcpy(p,local_38,(ulong)*local_68);
            uVar9 = (ulong)*puVar1;
          }
          p = p + uVar9;
        }
        else if (local_6c != 0) {
          uVar9 = 0;
          do {
            uVar9 = uVar9 + 1;
            local_58.typ = VM_INT;
            local_58.val.obj = (vm_obj_id_t)uVar9;
            vm_val_t::ll_index(&local_88,&local_48,&local_58);
            sVar5 = utf8_ptr::s_putch(p,local_48.val.intval);
            p = p + sVar5;
          } while (uVar2 != uVar9);
        }
        local_60 = local_60 - 1;
      } while (local_60 != 0);
    }
    CVmBif::retval_obj(local_70);
    sp_ = sp_ + -1;
    return;
  }
LAB_00226895:
  err_throw(0x902);
}

Assistant:

void CVmBifTADS::make_string(VMG_ uint argc)
{
    vm_val_t val;
    long rpt;
    vm_obj_id_t new_str_obj;
    CVmObjString *new_str;
    size_t new_str_len;
    char *new_strp;
    const char *strp = 0;
    int lst_len = -1;
    size_t i;
    utf8_ptr dst;
    
    /* check arguments */
    check_argc_range(vmg_ argc, 1, 2);

    /* get the base value */
    G_stk->pop(&val);

    /* if there's a repeat count, get it */
    rpt = (argc >= 2 ? pop_long_val(vmg0_) : 1);

    /* if the repeat count is less than zero, it's an error */
    if (rpt < 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* leave the original value on the stack to protect it from GC */
    G_stk->push(&val);

    /* 
     *   see what we have, and calculate how much space we'll need for the
     *   result string 
     */
    switch(val.typ)
    {
    case VM_LIST:
        /* it's a list of integers giving unicode character values */
        lst_len = val.ll_length(vmg0_);

    do_list:
        /* 
         *   Run through the list and get the size of each character, so
         *   we can determine how long the string will have to be. 
         */
        for (new_str_len = 0, i = 1 ; (int)i <= lst_len ; ++i)
        {
            /* get this element */
            vm_val_t ele_val;
            val.ll_index(vmg_ &ele_val, i);

            /* if it's not an integer, it's an error */
            if (ele_val.typ != VM_INT)
                err_throw(VMERR_INT_VAL_REQD);

            /* add this character's byte size to the string size */
            new_str_len +=
                utf8_ptr::s_wchar_size((wchar_t)ele_val.val.intval);
        }
        break;

    case VM_SSTRING:
        /* get the string pointer */
        strp = G_const_pool->get_ptr(val.val.ofs);
        
    do_string:
        /* 
         *   it's a string - the output length is the same as the input
         *   length 
         */
        new_str_len = vmb_get_len(strp);
        break;

    case VM_INT:
        /* 
         *   it's an integer giving a unicode character value - we just
         *   need enough space to store this particular character 
         */
        new_str_len = utf8_ptr::s_wchar_size((wchar_t)val.val.intval);
        break;

    case VM_OBJ:
        /* check to see if it's a string */
        if ((strp = val.get_as_string(vmg0_)) != 0)
            goto do_string;

        /* check to see if it's a list */
        if (val.is_listlike(vmg0_) && (lst_len = val.ll_length(vmg0_)) >= 0)
            goto do_list;

        /* it's invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
        break;

    default:
        /* other types are invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
        break;
    }

    /* 
     *   if the length times the repeat count would be over the maximum
     *   16-bit string length, it's an error 
     */
    if (new_str_len * rpt > 0xffffL - VMB_LEN)
        err_throw(VMERR_BAD_VAL_BIF);

    /* multiply the length by the repeat count */
    new_str_len *= rpt;
    
    /* allocate the string and gets its buffer */
    new_str_obj = CVmObjString::create(vmg_ FALSE, new_str_len);
    new_str = (CVmObjString *)vm_objp(vmg_ new_str_obj);
    new_strp = new_str->cons_get_buf();
    
    /* set up the destination pointer */
    dst.set(new_strp);

    /* run through the number of iterations requested */
    for ( ; rpt != 0 ; --rpt)
    {
        /* build one iteration of the string, according to the type */
        if (lst_len >= 0)
        {
            /* run through the list */
            for (i = 1 ; i <= (size_t)lst_len ; ++i)
            {
                /* get this element */
                vm_val_t ele_val;
                val.ll_index(vmg_ &ele_val, i);

                /* add this character to the string */
                dst.setch((wchar_t)ele_val.val.intval);
            }
        }
        else if (strp != 0)
        {
            /* copy the string's contents into the output string */
            memcpy(dst.getptr(), strp + VMB_LEN, vmb_get_len(strp));

            /* advance past the bytes we copied */
            dst.set(dst.getptr() + vmb_get_len(strp));
        }
        else
        {
            /* set this int value */
            dst.setch((wchar_t)val.val.intval);
        }
    }

    /* return the new string */
    retval_obj(vmg_ new_str_obj);

    /* discard the GC protection */
    G_stk->discard();
}